

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::SectionTemplateNode::Expand
          (SectionTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  TemplateDictionaryInterface *child;
  bool error_free;
  Iterator *di;
  TemplateCache *cache_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionaryInterface *dictionary_local;
  ExpandEmitter *output_buffer_local;
  SectionTemplateNode *this_local;
  undefined4 extraout_var;
  
  if ((this->token_).text == "__{{MAIN}}__") {
    iVar2 = (*(this->super_TemplateNode)._vptr_TemplateNode[5])
                      (this,output_buffer,dictionary,per_expand_data,1,cache);
    return (bool)((byte)iVar2 & 1);
  }
  if ((this->hidden_by_default_ & 1U) == 0) {
    uVar3 = (*dictionary->_vptr_TemplateDictionaryInterface[3])(dictionary,&this->variable_);
    if ((uVar3 & 1) == 0) goto LAB_0014c4d6;
  }
  else {
    uVar3 = (*dictionary->_vptr_TemplateDictionaryInterface[9])(dictionary,&this->variable_);
    if ((uVar3 & 1) != 0) {
LAB_0014c4d6:
      iVar2 = (*dictionary->_vptr_TemplateDictionaryInterface[8])(dictionary,&this->variable_);
      plVar4 = (long *)CONCAT44(extraout_var,iVar2);
      uVar5 = (**(code **)(*plVar4 + 0x10))();
      if ((uVar5 & 1) == 0) {
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
        iVar2 = (*(this->super_TemplateNode)._vptr_TemplateNode[5])
                          (this,output_buffer,dictionary,per_expand_data,1,cache);
        return (bool)((byte)iVar2 & 1);
      }
      bVar7 = true;
      while (uVar5 = (**(code **)(*plVar4 + 0x10))(), (uVar5 & 1) != 0) {
        uVar6 = (**(code **)(*plVar4 + 0x18))();
        bVar1 = (**(code **)(*plVar4 + 0x10))();
        iVar2 = (*(this->super_TemplateNode)._vptr_TemplateNode[5])
                          (this,output_buffer,uVar6,per_expand_data,(ulong)((bVar1 ^ 0xff) & 1),
                           cache);
        bVar7 = (bVar7 & (byte)iVar2 & 1) != 0;
      }
      if (plVar4 == (long *)0x0) {
        return bVar7;
      }
      (**(code **)(*plVar4 + 8))();
      return bVar7;
    }
  }
  return true;
}

Assistant:

bool SectionTemplateNode::Expand(
    ExpandEmitter *output_buffer,
    const TemplateDictionaryInterface *dictionary,
    PerExpandData *per_expand_data,
    const TemplateCache *cache) const {
  // The section named __{{MAIN}}__ is special: you always expand it
  // exactly once using the containing (main) dictionary.
  if (token_.text == kMainSectionName) {
    return ExpandOnce(output_buffer, dictionary, per_expand_data, true, cache);
  } else if (hidden_by_default_ ?
             !dictionary->IsUnhiddenSection(variable_) :
             dictionary->IsHiddenSection(variable_)) {
    // Some dictionaries might have sections that can be explicitly hidden
    // and unhidden, so by default both IsHidden() and IsUnhidden() are false,
    // in which case hidden_by_default_ controls the behavior.
    return true;      // if this section is "hidden", do nothing
  }

  TemplateDictionaryInterface::Iterator* di =
      dictionary->CreateSectionIterator(variable_);

  // If there are no child dictionaries, that means we should expand with the
  // current dictionary instead. This corresponds to the situation where
  // template variables within a section are set on the template-wide dictionary
  // instead of adding a dictionary to the section and setting them there.
  if (!di->HasNext()) {
    delete di;
    return ExpandOnce(output_buffer, dictionary, per_expand_data,
                      true, cache);
  }

  // Otherwise, there's at least one child dictionary, and when expanding this
  // section, we should use the child dictionaries instead of the current one.
  bool error_free = true;
  while (di->HasNext()) {
    const TemplateDictionaryInterface& child = di->Next();
    error_free &= ExpandOnce(output_buffer, &child, per_expand_data,
                             !di->HasNext(), cache);
  }
  delete di;
  return error_free;
}